

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanFlowCollectionEnd(Scanner *this,bool IsSequence)

{
  Token local_50;
  
  removeSimpleKeyCandidatesOnFlowLevel(this,this->FlowLevel);
  this->IsSimpleKeyAllowed = false;
  local_50.Value._M_dataplus._M_p = (pointer)&local_50.Value.field_2;
  local_50.Value._M_string_length = 0;
  local_50.Value.field_2._M_local_buf[0] = '\0';
  local_50.Kind = (uint)!IsSequence * 2 + TK_FlowSequenceEnd;
  local_50.Range.Data = this->Current;
  local_50.Range.Length = 1;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,&local_50);
  if (this->FlowLevel != 0) {
    this->FlowLevel = this->FlowLevel - 1;
  }
  std::__cxx11::string::_M_dispose();
  return true;
}

Assistant:

bool Scanner::scanFlowCollectionEnd(bool IsSequence) {
  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = false;
  Token T;
  T.Kind = IsSequence ? Token::TK_FlowSequenceEnd
                      : Token::TK_FlowMappingEnd;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  if (FlowLevel)
    --FlowLevel;
  return true;
}